

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O0

void wasm::Fuzzer::printTypes(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  Printed PVar1;
  Printed PVar2;
  value_type vVar3;
  bool bVar4;
  ostream *poVar5;
  size_type sVar6;
  const_reference pvVar7;
  pointer ppVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_long>,_false,_true>,_bool>
  pVar9;
  undefined1 in_stack_fffffffffffffd68 [15];
  undefined1 in_stack_fffffffffffffd77;
  ostream *in_stack_fffffffffffffd78;
  ostream *in_stack_fffffffffffffd80;
  ostream *in_stack_fffffffffffffd88;
  __optional_ne_t<wasm::RecGroup,_wasm::RecGroup> local_212;
  Printed local_1e8;
  type_conflict *local_1c0;
  type_conflict *inserted;
  type *it;
  undefined1 local_1a8;
  pair<const_wasm::HeapType,_unsigned_long> local_1a0;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_long>,_false,_true>,_bool>
  local_190;
  uintptr_t local_180;
  Printed local_178;
  undefined8 local_150;
  undefined8 local_148;
  HeapType local_140;
  value_type type;
  size_t i;
  anon_class_8_1_c7f65e1f inRecGroup;
  optional<wasm::RecGroup> currRecGroup;
  unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  seen;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  IndexedTypeNameGenerator<FatalTypeNameGenerator> print;
  FatalTypeNameGenerator fatalGenerator;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types_local;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"Built ");
  sVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(types);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
  std::operator<<(poVar5," types:\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
  IndexedTypeNameGenerator<wasm::Fuzzer::printTypes(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&)::FatalTypeNameGenerator>
  ::IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const>
            ((IndexedTypeNameGenerator<wasm::Fuzzer::printTypes(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&)::FatalTypeNameGenerator>
              *)local_a8,types,
             (FatalTypeNameGenerator *)((long)&print.names._M_h._M_single_bucket + 7),&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::
  unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  ::unordered_map((unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                   *)&currRecGroup.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::RecGroup>._M_engaged);
  std::optional<wasm::RecGroup>::optional((optional<wasm::RecGroup> *)&inRecGroup);
  i = (size_t)&inRecGroup;
  for (type.id = 0; vVar3.id = type.id,
      sVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(types),
      vVar3.id < sVar6; type.id = type.id + 1) {
    pvVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[](types,type.id)
    ;
    local_140.id = pvVar7->id;
    bVar4 = HeapType::isBasic(&local_140);
    local_212 = false;
    if (!bVar4) {
      local_148 = wasm::HeapType::getRecGroup();
      local_212 = std::operator!=((RecGroup *)&local_148,(optional<wasm::RecGroup> *)&inRecGroup);
    }
    if (local_212 != false) {
      bVar4 = printTypes::anon_class_8_1_c7f65e1f::operator()((anon_class_8_1_c7f65e1f *)&i);
      if (bVar4) {
        std::operator<<((ostream *)&std::cout,")\n");
      }
      local_150 = wasm::HeapType::getRecGroup();
      std::optional<wasm::RecGroup>::operator=
                ((optional<wasm::RecGroup> *)&inRecGroup,(RecGroup *)&local_150);
      bVar4 = printTypes::anon_class_8_1_c7f65e1f::operator()((anon_class_8_1_c7f65e1f *)&i);
      if (bVar4) {
        std::operator<<((ostream *)&std::cout,"(rec\n");
      }
    }
    bVar4 = printTypes::anon_class_8_1_c7f65e1f::operator()((anon_class_8_1_c7f65e1f *)&i);
    if (bVar4) {
      std::operator<<((ostream *)&std::cout,' ');
    }
    bVar4 = HeapType::isBasic(&local_140);
    if (bVar4) {
      poVar5 = std::operator<<((ostream *)&std::cout,"(type $");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,type.id);
      poVar5 = std::operator<<(poVar5,' ');
      local_180 = local_140.id;
      TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<FatalTypeNameGenerator>_>::operator()
                (&local_178,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<FatalTypeNameGenerator>_> *)
                 local_a8,local_140);
      PVar1.generateName.super__Function_base._M_functor._M_pod_data[7] = in_stack_fffffffffffffd77;
      PVar1._0_15_ = in_stack_fffffffffffffd68;
      PVar1.generateName.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd78;
      PVar1.generateName.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffd80;
      PVar1.generateName._M_invoker = (_Invoker_type)in_stack_fffffffffffffd88;
      poVar5 = (ostream *)wasm::operator<<(poVar5,PVar1);
      std::operator<<(poVar5,")\n");
      HeapType::Printed::~Printed(&local_178);
    }
    else {
      std::pair<const_wasm::HeapType,_unsigned_long>::pair<wasm::HeapType_&,_unsigned_long_&,_true>
                (&local_1a0,&local_140,&type.id);
      pVar9 = std::
              unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
              ::insert((unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                        *)&currRecGroup.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::RecGroup>._M_engaged,&local_1a0);
      it = (type *)pVar9.first.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>.
                   _M_cur;
      local_1a8 = pVar9.second;
      local_190.first.
      super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>._M_cur =
           (_Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>)
           (_Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>)it;
      local_190.second = (bool)local_1a8;
      inserted = (type_conflict *)
                 std::
                 get<0ul,std::__detail::_Node_iterator<std::pair<wasm::HeapType_const,unsigned_long>,false,true>,bool>
                           (&local_190);
      local_1c0 = std::
                  get<1ul,std::__detail::_Node_iterator<std::pair<wasm::HeapType_const,unsigned_long>,false,true>,bool>
                            (&local_190);
      if ((*local_1c0 & 1U) == 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"(type $");
        in_stack_fffffffffffffd88 = (ostream *)std::ostream::operator<<(poVar5,type.id);
        in_stack_fffffffffffffd80 = std::operator<<(in_stack_fffffffffffffd88," identical to $");
        ppVar8 = std::__detail::
                 _Node_iterator<std::pair<const_wasm::HeapType,_unsigned_long>,_false,_true>::
                 operator->((_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_long>,_false,_true>
                             *)inserted);
        in_stack_fffffffffffffd78 =
             (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd80,ppVar8->second);
        std::operator<<(in_stack_fffffffffffffd78,")");
      }
      else {
        TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<FatalTypeNameGenerator>_>::operator()
                  (&local_1e8,
                   (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<FatalTypeNameGenerator>_> *
                   )local_a8,local_140);
        PVar2.generateName.super__Function_base._M_functor._M_pod_data[7] =
             in_stack_fffffffffffffd77;
        PVar2._0_15_ = in_stack_fffffffffffffd68;
        PVar2.generateName.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd78;
        PVar2.generateName.super__Function_base._M_manager =
             (_Manager_type)in_stack_fffffffffffffd80;
        PVar2.generateName._M_invoker = (_Invoker_type)in_stack_fffffffffffffd88;
        wasm::operator<<((ostream *)&std::cout,PVar2);
        HeapType::Printed::~Printed(&local_1e8);
      }
      std::operator<<((ostream *)&std::cout,"\n");
    }
  }
  bVar4 = printTypes::anon_class_8_1_c7f65e1f::operator()((anon_class_8_1_c7f65e1f *)&i);
  if (bVar4) {
    std::operator<<((ostream *)&std::cout,")\n");
  }
  std::
  unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                    *)&currRecGroup.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::RecGroup>._M_engaged);
  IndexedTypeNameGenerator<FatalTypeNameGenerator>::~IndexedTypeNameGenerator
            ((IndexedTypeNameGenerator<FatalTypeNameGenerator> *)local_a8);
  return;
}

Assistant:

void Fuzzer::printTypes(const std::vector<HeapType>& types) {
  std::cout << "Built " << types.size() << " types:\n";
  struct FatalTypeNameGenerator
    : TypeNameGeneratorBase<FatalTypeNameGenerator> {
    TypeNames getNames(HeapType type) {
      Fatal() << "trying to print unknown heap type";
    }
  } fatalGenerator;
  IndexedTypeNameGenerator<FatalTypeNameGenerator> print(types, fatalGenerator);
  std::unordered_map<HeapType, size_t> seen;
  std::optional<RecGroup> currRecGroup;
  auto inRecGroup = [&]() { return currRecGroup && currRecGroup->size() > 1; };
  for (size_t i = 0; i < types.size(); ++i) {
    auto type = types[i];
    if (!type.isBasic() && type.getRecGroup() != currRecGroup) {
      if (inRecGroup()) {
        std::cout << ")\n";
      }
      currRecGroup = type.getRecGroup();
      if (inRecGroup()) {
        std::cout << "(rec\n";
      }
    }
    if (inRecGroup()) {
      std::cout << ' ';
    }
    if (type.isBasic()) {
      std::cout << "(type $" << i << ' ' << print(type) << ")\n";
      continue;
    }
    auto [it, inserted] = seen.insert({type, i});
    if (inserted) {
      std::cout << print(type);
    } else {
      std::cout << "(type $" << i << " identical to $" << it->second << ")";
    }
    std::cout << "\n";
  }
  if (inRecGroup()) {
    std::cout << ")\n";
  }
}